

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O3

void RtMidi_init(RtMidi *midi,lua_State *L,int index)

{
  mapped_type *pmVar1;
  key_type local_20;
  
  (*midi->_vptr_RtMidi[6])(midi,anon_unknown.dwarf_7462::RtMidiDefaultErrorCallback,L);
  local_20.first = midi;
  local_20.second = L;
  pmVar1 = std::
           map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
           ::operator[]((map<std::pair<RtMidi_*,_lua_State_*>,_int,_std::less<std::pair<RtMidi_*,_lua_State_*>_>,_std::allocator<std::pair<const_std::pair<RtMidi_*,_lua_State_*>,_int>_>_>
                         *)(anonymous_namespace)::RtMidi_callbacks,&local_20);
  *pmVar1 = -2;
  return;
}

Assistant:

LUA_RTMIDI_LOCAL void RtMidi_init(RtMidi &midi, lua_State *L, int index) {
	midi.setErrorCallback(RtMidiDefaultErrorCallback, L);
	RtMidi_callbacks[{&midi, L}] = LUA_NOREF;

//	lua_pushlightuserdata(L, &REGISTRY_CALLBACK_ENABLED);
//	lua_rawget(L, LUA_REGISTRYINDEX);
//	lua_pushvalue(L, index);
//	lua_pushnil(L);
//	lua_rawset(L, -3);
//	lua_pop(L, 1);
}